

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KNNValidatorTests.cpp
# Opt level: O0

void CoreML::KNNValidatorTests::generateInterface(Model *m1)

{
  uchar this [8];
  FeatureType *pFVar1;
  ArrayFeatureType *pAVar2;
  RepeatedField<long> *this_00;
  FeatureDescription *this_01;
  FeatureType *outputType;
  FeatureDescription *output;
  FeatureType *local_68;
  FeatureType *inputType;
  FeatureDescription *input;
  allocator local_41;
  string local_40;
  Metadata *metadata;
  ModelDescription *interface;
  Model *m1_local;
  
  interface = (ModelDescription *)m1;
  Specification::Model::set_specificationversion(m1,5);
  metadata = (Metadata *)Specification::Model::mutable_description((Model *)interface);
  this = (uchar  [8])Specification::ModelDescription::mutable_metadata((ModelDescription *)metadata)
  ;
  local_40._M_storage._M_storage = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"Testing nearest neighbor validator",&local_41);
  Specification::Metadata::set_shortdescription((Metadata *)this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  inputType = (FeatureType *)
              Specification::ModelDescription::add_input((ModelDescription *)metadata);
  pFVar1 = (FeatureType *)operator_new(0x28);
  Specification::FeatureType::FeatureType(pFVar1);
  local_68 = pFVar1;
  pAVar2 = Specification::FeatureType::mutable_multiarraytype(pFVar1);
  this_00 = Specification::ArrayFeatureType::mutable_shape(pAVar2);
  output = (FeatureDescription *)0x4;
  google::protobuf::RepeatedField<long>::Add(this_00,(long *)&output);
  pAVar2 = Specification::FeatureType::mutable_multiarraytype(local_68);
  Specification::ArrayFeatureType::set_datatype(pAVar2,ArrayFeatureType_ArrayDataType_FLOAT32);
  Specification::FeatureDescription::set_name((FeatureDescription *)inputType,"input");
  Specification::FeatureDescription::set_allocated_type((FeatureDescription *)inputType,local_68);
  this_01 = Specification::ModelDescription::add_output((ModelDescription *)metadata);
  pFVar1 = (FeatureType *)operator_new(0x28);
  Specification::FeatureType::FeatureType(pFVar1);
  Specification::FeatureType::mutable_stringtype(pFVar1);
  Specification::FeatureDescription::set_name(this_01,"output");
  Specification::FeatureDescription::set_allocated_type(this_01,pFVar1);
  Specification::ModelDescription::set_predictedfeaturename((ModelDescription *)metadata,"output");
  return;
}

Assistant:

void generateInterface(Specification::Model& m1) {

        m1.set_specificationversion(MLMODEL_SPECIFICATION_VERSION);
        Specification::ModelDescription* interface = m1.mutable_description();
        Specification::Metadata* metadata = interface->mutable_metadata();
        metadata->set_shortdescription(std::string("Testing nearest neighbor validator"));

        Specification::FeatureDescription *input = interface->add_input();
        Specification::FeatureType* inputType = new Specification::FeatureType;
        inputType->mutable_multiarraytype()->mutable_shape()->Add(4);
        inputType->mutable_multiarraytype()->set_datatype(::CoreML::Specification::ArrayFeatureType_ArrayDataType_FLOAT32);
        input->set_name("input");
        input->set_allocated_type(inputType);

        Specification::FeatureDescription *output = interface->add_output();
        Specification::FeatureType* outputType = new Specification::FeatureType;
        outputType->mutable_stringtype();
        output->set_name("output");
        output->set_allocated_type(outputType);
        
        interface->set_predictedfeaturename("output");

    }